

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtReadHex(word *pTruth,char *pString)

{
  int iVar1;
  int d;
  word wVar2;
  word local_38;
  uint local_30;
  int nDigits;
  int Digit;
  int nVars;
  int k;
  char *pString_local;
  word *pTruth_local;
  
  _nVars = pString;
  if ((*pString == '0') && (pString[1] == 'x')) {
    _nVars = pString + 2;
  }
  local_30 = 0;
  Digit = 0;
  while (iVar1 = Abc_TtIsHexDigit(_nVars[Digit]), iVar1 != 0) {
    local_30 = local_30 + 1;
    Digit = Digit + 1;
  }
  if (local_30 == 1) {
    if ((*_nVars == '0') || (*_nVars == 'F')) {
      wVar2 = 0xffffffffffffffff;
      if (*_nVars == '0') {
        wVar2 = 0;
      }
      *pTruth = wVar2;
      return 0;
    }
    if ((*_nVars == '5') || (*_nVars == 'A')) {
      if (*_nVars == '5') {
        local_38 = s_Truths6Neg[0];
      }
      else {
        local_38 = s_Truths6[0];
      }
      *pTruth = local_38;
      return 1;
    }
  }
  iVar1 = Abc_Base2Log(local_30);
  iVar1 = iVar1 + 2;
  Digit = Abc_TtWordNum(iVar1);
  while (Digit = Digit + -1, -1 < Digit) {
    pTruth[Digit] = 0;
  }
  Digit = 0;
  while( true ) {
    if ((int)local_30 <= Digit) {
      if (iVar1 < 6) {
        wVar2 = Abc_Tt6Stretch(*pTruth,iVar1);
        *pTruth = wVar2;
      }
      return iVar1;
    }
    d = Abc_TtReadHexDigit(_nVars[(int)((local_30 - 1) - Digit)]);
    if ((d < 0) || (0xf < d)) break;
    Abc_TtSetHex(pTruth,Digit,d);
    Digit = Digit + 1;
  }
  __assert_fail("Digit >= 0 && Digit < 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                ,0x3ae,"int Abc_TtReadHex(word *, char *)");
}

Assistant:

static inline int Abc_TtReadHex( word * pTruth, char * pString )
{
    int k, nVars, Digit, nDigits;
    // skip the first 2 symbols if they are "0x"
    if ( pString[0] == '0' && pString[1] == 'x' )
        pString += 2;
    // count the number of hex digits
    nDigits = 0;
    for ( k = 0; Abc_TtIsHexDigit(pString[k]); k++ )
        nDigits++;
    if ( nDigits == 1 )
    {
        if ( pString[0] == '0' || pString[0] == 'F' )
        {
            pTruth[0] = (pString[0] == '0') ? 0 : ~(word)0;
            return 0;
        }
        if ( pString[0] == '5' || pString[0] == 'A' )
        {
            pTruth[0] = (pString[0] == '5') ? s_Truths6Neg[0] : s_Truths6[0];
            return 1;
        }
    }
    // determine the number of variables
    nVars = 2 + Abc_Base2Log( nDigits );
    // clean storage
    for ( k = Abc_TtWordNum(nVars) - 1; k >= 0; k-- )
        pTruth[k] = 0;
    // read hexadecimal digits in the reverse order
    // (the last symbol in the string is the least significant digit)
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = Abc_TtReadHexDigit( pString[nDigits - 1 - k] );
        assert( Digit >= 0 && Digit < 16 );
        Abc_TtSetHex( pTruth, k, Digit );
    }
    if ( nVars < 6 )
        pTruth[0] = Abc_Tt6Stretch( pTruth[0], nVars );
    return nVars;
}